

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall Engine::makeDecision(Engine *this,DecInfo *di,int alt)

{
  int iVar1;
  bool bVar2;
  mapped_type *pmVar3;
  vec<Lit> *this_00;
  long *in_RSI;
  long in_RDI;
  stringstream ss_1;
  stringstream ss;
  value_type_conflict *in_stack_fffffffffffffc38;
  ostream *poVar4;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffc40;
  Reason local_3b0;
  int local_3a4;
  SAT *in_stack_fffffffffffffc60;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  Lit in_stack_fffffffffffffc74;
  string local_380 [7];
  undefined1 in_stack_fffffffffffffc87;
  LitRel in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc8c;
  IntVar *in_stack_fffffffffffffc90;
  stringstream local_360 [16];
  ostream local_350 [376];
  string local_1d8 [48];
  long local_1a8;
  stringstream local_1a0 [12];
  int in_stack_fffffffffffffe6c;
  ostream local_190 [384];
  long *local_10;
  
  *(long *)(in_RDI + 0x120) = *(long *)(in_RDI + 0x120) + 1;
  local_10 = in_RSI;
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  if (*local_10 == 0) {
    bVar2 = doProfiling();
    if (bVar2) {
      std::__cxx11::stringstream::stringstream(local_360);
      getLitString_abi_cxx11_(in_stack_fffffffffffffe6c);
      std::operator<<(local_350,local_380);
      std::__cxx11::string::~string(local_380);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator=
                ((string *)&mostRecentLabel_abi_cxx11_,(string *)&stack0xfffffffffffffc60);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffc60);
      std::__cxx11::stringstream::~stringstream(local_360);
    }
    local_3a4 = (int)toLit(0x286cdd);
    Reason::Reason(&local_3b0,(Clause *)0x0);
    SAT::enqueue(in_stack_fffffffffffffc60,in_stack_fffffffffffffc74,
                 (Reason)in_stack_fffffffffffffc68);
  }
  else {
    bVar2 = doProfiling();
    if (bVar2) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      poVar4 = local_190;
      local_1a8 = *local_10;
      pmVar3 = std::
               map<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IntVar_*>,_std::allocator<std::pair<IntVar_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IntVar_*>,_std::allocator<std::pair<IntVar_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffc74.x,in_stack_fffffffffffffc70),
                            (key_type *)in_stack_fffffffffffffc68._pt);
      std::operator<<(poVar4,(string *)pmVar3);
      iVar1 = *(int *)((long)local_10 + 0xc);
      if (iVar1 == 1) {
        std::operator<<(local_190,"==");
      }
      else if (iVar1 == 2) {
        std::operator<<(local_190,">=");
      }
      else if (iVar1 == 3) {
        std::operator<<(local_190,"<=");
      }
      else {
        std::operator<<(local_190,"?=");
      }
      std::ostream::operator<<(local_190,(int)local_10[1]);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator=((string *)&mostRecentLabel_abi_cxx11_,local_1d8);
      std::__cxx11::string::~string(local_1d8);
      std::__cxx11::stringstream::~stringstream(local_1a0);
    }
    IntVar::set(in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88,
                (bool)in_stack_fffffffffffffc87);
  }
  if ((((so.ldsb & 1U) != 0) && (*local_10 != 0)) && (*(int *)((long)local_10 + 0xc) == 1)) {
    this_00 = vec<vec<Lit>_>::last(&sat.trail);
    vec<Lit>::operator[](this_00,0);
    LDSB::processDec((LDSB *)in_stack_fffffffffffffc68._pt,in_stack_fffffffffffffc74);
  }
  return;
}

Assistant:

inline void Engine::makeDecision(DecInfo& di, int alt) {
	++nodes;
	altpath.push_back(alt);
#ifdef HAS_VAR_IMPACT
	vec<int> sizes(0);
	if (last_int) last_int->updateImpact(processImpact(var_sizes, getVarSizes(sizes)));
#endif
	if (di.var != nullptr) {
#if DEBUG_VERBOSE
		std::cerr << "makeDecision: " << intVarString[(IntVar*)di.var] << " / " << di.val << " (" << alt
							<< ")" << std::endl;
#endif
#ifdef HAS_PROFILER
		if (doProfiling()) {
			std::stringstream ss;
			/* ss << intVarString[(IntVar*)di.var] << " / " << di.val << " (" << alt << ")"; */
			ss << intVarString[(IntVar*)di.var];
			switch (di.type) {
				case 1:
					ss << "==";
					break;
				case 2:
					ss << ">=";
					break;
				case 3:
					ss << "<=";
					break;
				default:
					ss << "?=";
					break;
			}
			ss << di.val;
			mostRecentLabel = ss.str();
		}
#endif
#ifdef HAS_VAR_IMPACT
		last_int = (IntVar*)di.var;
		if (sizes.size())
			sizes.moveTo(var_sizes);
		else
			getVarSizes(var_sizes);
#endif
		((IntVar*)di.var)->set(di.val, static_cast<LitRel>(di.type ^ alt));
	} else {
#if DEBUG_VERBOSE
		std::cerr << "enqueuing SAT literal: " << di.val << "^" << alt << " = " << (di.val ^ alt)
							<< std::endl;
#endif
#ifdef HAS_PROFILER
		if (doProfiling()) {
			std::stringstream ss;
			ss << getLitString(di.val ^ alt);
			mostRecentLabel = ss.str();
		}
#endif
#ifdef HAS_VAR_IMPACT
		last_int = nullptr;
#endif
		sat.enqueue(toLit(di.val ^ alt));
	}
	if (so.ldsb && (di.var != nullptr) && di.type == 1) {
		ldsb.processDec(sat.trail.last()[0]);
	}
	//  if (opt_var && di.var == opt_var && ((IntVar*) di.var)->isFixed()) printf("objective = %d\n",
	//  ((IntVar*) di.var)->getVal());
}